

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O2

void Fxch_SCHashTableDelete(Fxch_SCHashTable_t *pSCHashTable)

{
  Fxch_SubCube_t *__ptr;
  uint i;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 <= pSCHashTable->SizeMask; uVar1 = uVar1 + 1) {
    __ptr = pSCHashTable->pBins[uVar1].vSCData;
    if (__ptr != (Fxch_SubCube_t *)0x0) {
      free(__ptr);
      pSCHashTable->pBins[uVar1].vSCData = (Fxch_SubCube_t *)0x0;
    }
  }
  Vec_IntErase(&pSCHashTable->vSubCube0);
  Vec_IntErase(&pSCHashTable->vSubCube1);
  free(pSCHashTable->pBins);
  free(pSCHashTable);
  return;
}

Assistant:

void Fxch_SCHashTableDelete( Fxch_SCHashTable_t* pSCHashTable )
{
    unsigned i;
    for ( i = 0; i <= pSCHashTable->SizeMask; i++ )
        ABC_FREE( pSCHashTable->pBins[i].vSCData );
    Vec_IntErase( &pSCHashTable->vSubCube0 );
    Vec_IntErase( &pSCHashTable->vSubCube1 );
    ABC_FREE( pSCHashTable->pBins );
    ABC_FREE( pSCHashTable );
}